

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

bool jessilib::equalsi<char16_t,char>
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> lhs,
               basic_string_view<char,_std::char_traits<char>_> rhs)

{
  char16_t cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  jessilib *this;
  char16_t *pcVar7;
  size_t sVar8;
  char *pcVar9;
  decode_result dVar10;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  
  pcVar9 = rhs._M_str;
  this = (jessilib *)rhs._M_len;
  pcVar7 = lhs._M_str;
  sVar8 = lhs._M_len;
  while( true ) {
    if (sVar8 == 0) {
      return this == (jessilib *)0x0;
    }
    if (this == (jessilib *)0x0) break;
    cVar1 = *pcVar7;
    pcVar5 = (char *)(ulong)(ushort)cVar1;
    if (((sVar8 == 1) || ((cVar1 & 0xfc00U) != 0xd800)) || (((ushort)pcVar7[1] & 0xfc00) != 0xdc00))
    {
      lVar4 = 1;
    }
    else {
      pcVar5 = (char *)(ulong)((uint)(ushort)cVar1 * 0x400 + (uint)(ushort)pcVar7[1] + 0xfca02400);
      lVar4 = 2;
    }
    in_string._M_str = pcVar5;
    in_string._M_len = (size_t)pcVar9;
    dVar10 = decode_codepoint_utf8<char>(this,in_string);
    sVar6 = dVar10.units;
    if (sVar6 == 0) {
      return false;
    }
    if ((wchar32)pcVar5 != dVar10.codepoint) {
      iVar2 = jessilib::fold((wchar32)pcVar5);
      iVar3 = jessilib::fold(dVar10.codepoint);
      if (iVar2 != iVar3) {
        return false;
      }
    }
    pcVar7 = pcVar7 + lVar4;
    pcVar9 = pcVar9 + sVar6;
    this = this + -sVar6;
    sVar8 = sVar8 - lVar4;
  }
  return false;
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}